

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgEnc.c
# Opt level: O0

void zvgEncSetClipWin(int xMin,int yMin,int xMax,int yMax)

{
  uint uVar1;
  int iVar2;
  undefined4 local_18;
  int tSwap;
  int yMax_local;
  int xMax_local;
  int yMin_local;
  int xMin_local;
  
  tSwap = xMax;
  xMax_local = xMin;
  if ((ZvgENC.encFlags & 1) != 0) {
    xMax_local = xMin ^ 0xffffffff;
    tSwap = xMax ^ 0xffffffff;
  }
  local_18 = yMax;
  yMax_local = yMin;
  if ((ZvgENC.encFlags & 2) != 0) {
    yMax_local = yMin ^ 0xffffffff;
    local_18 = yMax ^ 0xffffffff;
  }
  if ((ZvgENC.encFlags & 0x10) == 0) {
    if (xMax_local < -600) {
      xMax_local = -600;
    }
    else if (599 < xMax_local) {
      xMax_local = 599;
    }
    if (yMax_local < -0x1d8) {
      yMax_local = -0x1d8;
    }
    else if (0x1d7 < yMax_local) {
      yMax_local = 0x1d7;
    }
    if (tSwap < -600) {
      tSwap = -600;
    }
    else if (599 < tSwap) {
      tSwap = 599;
    }
    if ((int)local_18 < -0x1d8) {
      local_18 = 0xfffffe28;
    }
    else if (0x1d7 < (int)local_18) {
      local_18 = 0x1d7;
    }
  }
  else {
    if (xMax_local < -0x200) {
      xMax_local = -0x200;
    }
    else if (0x1ff < xMax_local) {
      xMax_local = 0x1ff;
    }
    if (yMax_local < -0x180) {
      yMax_local = -0x180;
    }
    else if (0x17f < yMax_local) {
      yMax_local = 0x17f;
    }
    if (tSwap < -0x200) {
      tSwap = -0x200;
    }
    else if (0x1ff < tSwap) {
      tSwap = 0x1ff;
    }
    if ((int)local_18 < -0x180) {
      local_18 = 0xfffffe80;
    }
    else if (0x17f < (int)local_18) {
      local_18 = 0x17f;
    }
  }
  iVar2 = tSwap;
  uVar1 = local_18;
  if (tSwap < xMax_local) {
    tSwap = xMax_local;
    xMax_local = iVar2;
  }
  if ((int)local_18 < yMax_local) {
    local_18 = yMax_local;
    yMax_local = uVar1;
  }
  ZvgENC.xMinClip = xMax_local;
  ZvgENC.yMinClip = yMax_local;
  ZvgENC.xMaxClip = tSwap;
  ZvgENC.yMaxClip = local_18;
  return;
}

Assistant:

void zvgEncSetClipWin( int xMin, int yMin, int xMax, int yMax)
{
	int	tSwap;

	// start by flipping window if needed

	if (ZvgENC.encFlags & ENCF_FLIPX)
	{	xMin = ~xMin;
		xMax = ~xMax;
	}

	if (ZvgENC.encFlags & ENCF_FLIPY)
	{	yMin = ~yMin;
		yMax = ~yMax;
	}

	// clip, clip window

	if (ZvgENC.encFlags & ENCF_NOOVS)
	{
		if (xMin < X_MIN)
			xMin = X_MIN;

		else if (xMin > X_MAX)
			xMin = X_MAX;

		if (yMin < Y_MIN)
			yMin = Y_MIN;

		else if (yMin > Y_MAX)
			yMin = Y_MAX;

		if (xMax < X_MIN)
			xMax = X_MIN;

		else if (xMax > X_MAX)
			xMax = X_MAX;

		if (yMax < Y_MIN)
			yMax = Y_MIN;

		else if (yMax > Y_MAX)
			yMax = Y_MAX;
	}
	else
	{		
		if (xMin < X_MIN_O)
			xMin = X_MIN_O;

		else if (xMin > X_MAX_O)
			xMin = X_MAX_O;

		if (yMin < Y_MIN_O)
			yMin = Y_MIN_O;

		else if (yMin > Y_MAX_O)
			yMin = Y_MAX_O;

		if (xMax < X_MIN_O)
			xMax = X_MIN_O;

		else if (xMax > X_MAX_O)
			xMax = X_MAX_O;

		if (yMax < Y_MIN_O)
			yMax = Y_MIN_O;

		else if (yMax > Y_MAX_O)
			yMax = Y_MAX_O;
	}

	// make sure a negative box size is not being requested

	if (xMin > xMax)
	{	tSwap = xMax;
		xMax = xMin;
		xMin = tSwap;
	}

	if (yMin > yMax)
	{	tSwap = yMax;
		yMax = yMin;
		yMin = tSwap;
	}

	// set new clip window

	ZvgENC.xMinClip = xMin;
	ZvgENC.yMinClip = yMin;
	ZvgENC.xMaxClip = xMax;
	ZvgENC.yMaxClip = yMax;
}